

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

string * testing::internal::GetPrefixUntilComma_abi_cxx11_(char *str)

{
  char *in_RSI;
  string *in_RDI;
  char *comma;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string *__s;
  undefined2 in_stack_ffffffffffffffd0;
  byte bVar1;
  undefined5 in_stack_ffffffffffffffd3;
  bool local_1a;
  allocator<char> local_19;
  char *local_18;
  
  __s = in_RDI;
  local_18 = strchr(in_RSI,0x2c);
  bVar1 = 0;
  local_1a = local_18 != (char *)0x0;
  if (local_1a) {
    __a = (allocator<char> *)&stack0xffffffffffffffd3;
    std::allocator<char>::allocator();
    bVar1 = 1;
    std::__cxx11::string::string<char_const*,void>
              (in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__a);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT53(in_stack_ffffffffffffffd3,CONCAT12(bVar1,in_stack_ffffffffffffffd0)),
               (char *)__s,(allocator<char> *)in_RDI);
  }
  local_1a = !local_1a;
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  }
  if (local_1a) {
    std::allocator<char>::~allocator(&local_19);
  }
  return __s;
}

Assistant:

inline std::string GetPrefixUntilComma(const char* str) {
  const char* comma = strchr(str, ',');
  return comma == nullptr ? str : std::string(str, comma);
}